

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cOHz.cpp
# Opt level: O0

int __thiscall OpenMD::COHZ::computeProperty1(COHZ *this,int frame,Molecule *mol)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  size_type sVar3;
  int in_ESI;
  long in_RDI;
  value_type_conflict2 *__x;
  int zBin;
  Vector3d pos;
  RotMat3x3d A;
  uint in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  StuntDouble *in_stack_ffffffffffffff38;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *this_01;
  Molecule *in_stack_ffffffffffffff88;
  Vector3d *in_stack_ffffffffffffffa8;
  Snapshot *in_stack_ffffffffffffffb0;
  
  Molecule::getRigidBodyAt
            ((Molecule *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff2c);
  StuntDouble::getA(in_stack_ffffffffffffff38);
  std::
  vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                *)(in_RDI + 0xeb8),(long)in_ESI);
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  push_back(in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
  Molecule::getCom(in_stack_ffffffffffffff88);
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 0x98));
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x16e1da);
  if (bVar1) {
    Snapshot::wrapVector(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  __x = (value_type_conflict2 *)(double)*(uint *)(in_RDI + 0xe70);
  this_01 = *(vector<int,_std::allocator<int>_> **)(in_RDI + 0xe80);
  Vector<double,_3U>::operator[]
            ((Vector<double,_3U> *)&stack0xffffffffffffff78,*(uint *)(in_RDI + 0xe88));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)(in_RDI + 0xf00),(long)in_ESI);
  std::vector<int,_std::allocator<int>_>::push_back(this_01,__x);
  this_00 = std::
            vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
            ::operator[]((vector<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>,_std::allocator<std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>_>_>
                          *)(in_RDI + 0xeb8),(long)in_ESI);
  sVar3 = std::
          vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
          size(this_00);
  iVar2 = (int)sVar3 + -1;
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x16e2e8);
  return iVar2;
}

Assistant:

int COHZ::computeProperty1(int frame, Molecule* mol) {
    RotMat3x3d A = mol->getRigidBodyAt(0)->getA();
    rotMats_[frame].push_back(A);

    Vector3d pos = mol->getCom();
    if (info_->getSimParams()->getUsePeriodicBoundaryConditions())
      currentSnapshot_->wrapVector(pos);
    int zBin = int(nZBins_ * (halfBoxZ_ + pos[axis_]) / boxZ_);
    zbin_[frame].push_back(zBin);

    return rotMats_[frame].size() - 1;
  }